

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

void * mk_sched_launch_worker_loop(void *data)

{
  mk_server *server_00;
  int iVar1;
  long *plVar2;
  mk_event_loop *pmVar3;
  void *__pointer;
  mk_list *pmVar4;
  mk_list *__mptr;
  mk_server *server;
  mk_sched_ctx *ctx;
  mk_sched_thread_conf *thinfo;
  mk_sched_notif *notif;
  mk_sched_worker *sched;
  mk_sched_worker_cb *wcb;
  mk_list *head;
  char *thread_name;
  unsigned_long len;
  int wid;
  int ret;
  void *data_local;
  
  head = (mk_list *)0x0;
  server_00 = *data;
  plVar2 = (long *)server_00->sched_ctx;
  _wid = data;
  mk_signal_thread_sigpipe_safe();
  mk_sched_thread_lists_init();
  mk_cache_worker_init();
  mk_vhost_fdt_worker_init(server_00);
  len._0_4_ = mk_sched_register_thread(server_00);
  plVar2 = (long *)(*plVar2 + (long)(int)len * 0xa0);
  pmVar3 = mk_event_loop_create(0x100);
  *plVar2 = (long)pmVar3;
  if (*plVar2 == 0) {
    mk_print(0x1001,"Error creating Scheduler loop");
    exit(1);
  }
  iVar1 = mk_utils_get_system_page_size();
  *(int *)((long)plVar2 + 0x44) = iVar1;
  __pointer = mk_mem_alloc_z(0x48);
  pthread_setspecific(mk_tls_sched_worker_notif,__pointer);
  len._4_4_ = mk_event_channel_create
                        ((mk_event_loop *)*plVar2,(int *)(plVar2 + 0xc),(int *)((long)plVar2 + 100),
                         __pointer);
  if (-1 < len._4_4_) {
    mk_list_init((mk_list *)(plVar2 + 10));
    mk_list_init((mk_list *)(plVar2 + 0x10));
    mk_list_init((mk_list *)(plVar2 + 0x12));
    mk_string_build((char **)&head,(unsigned_long *)&thread_name,"monkey: wrk/%i",
                    (ulong)(uint)(int)(short)plVar2[6]);
    mk_utils_worker_rename((char *)head);
    mk_mem_free(head);
    pthread_setspecific(mk_tls_sched_worker_node,plVar2);
    mk_plugin_core_thread(server_00);
    if (server_00->scheduler_mode == '\x01') {
      pmVar4 = mk_server_listen_init(server_00);
      plVar2[0xd] = (long)pmVar4;
      if (plVar2[0xd] == 0) {
        exit(1);
      }
    }
    pthread_mutex_lock((pthread_mutex_t *)&server_00->pth_mutex);
    server_00->pth_init = 1;
    pthread_cond_signal((pthread_cond_t *)&server_00->pth_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&server_00->pth_mutex);
    for (wcb = (mk_sched_worker_cb *)(server_00->sched_worker_callbacks).next;
        wcb != (mk_sched_worker_cb *)&server_00->sched_worker_callbacks;
        wcb = (mk_sched_worker_cb *)wcb->data) {
      (*(code *)wcb[-1]._head.prev)(wcb[-1]._head.next);
    }
    mk_mem_free(data);
    mk_server_worker_loop(server_00);
    return (void *)0x0;
  }
  exit(1);
}

Assistant:

void *mk_sched_launch_worker_loop(void *data)
{
    int ret;
    int wid;
    unsigned long len;
    char *thread_name = 0;
    struct mk_list *head;
    struct mk_sched_worker_cb *wcb;
    struct mk_sched_worker *sched = NULL;
    struct mk_sched_notif *notif = NULL;
    struct mk_sched_thread_conf *thinfo = data;
    struct mk_sched_ctx *ctx;
    struct mk_server *server;

    server = thinfo->server;
    ctx = server->sched_ctx;

    /* Avoid SIGPIPE signals on this thread */
    mk_signal_thread_sigpipe_safe();

    /* Init specific thread cache */
    mk_sched_thread_lists_init();
    mk_cache_worker_init();

    /* Virtual hosts: initialize per thread-vhost data */
    mk_vhost_fdt_worker_init(server);

    /* Register working thread */
    wid = mk_sched_register_thread(server);
    sched = &ctx->workers[wid];
    sched->loop = mk_event_loop_create(MK_EVENT_QUEUE_SIZE);
    if (!sched->loop) {
        mk_err("Error creating Scheduler loop");
        exit(EXIT_FAILURE);
    }


    sched->mem_pagesize = mk_utils_get_system_page_size();

    /*
     * Create the notification instance and link it to the worker
     * thread-scope list.
     */
    notif = mk_mem_alloc_z(sizeof(struct mk_sched_notif));
    MK_TLS_SET(mk_tls_sched_worker_notif, notif);

    /* Register the scheduler channel to signal active workers */
    ret = mk_event_channel_create(sched->loop,
                                  &sched->signal_channel_r,
                                  &sched->signal_channel_w,
                                  notif);
    if (ret < 0) {
        exit(EXIT_FAILURE);
    }

    mk_list_init(&sched->event_free_queue);
    mk_list_init(&sched->threads);
    mk_list_init(&sched->threads_purge);

    /*
     * ULONG_MAX BUG test only
     * =======================
     * to test the workaround we can use the following value:
     *
     *  thinfo->closed_connections = 1000;
     */

    //thinfo->ctx = thconf->ctx;

    /* Rename worker */
    mk_string_build(&thread_name, &len, "monkey: wrk/%i", sched->idx);
    mk_utils_worker_rename(thread_name);
    mk_mem_free(thread_name);

    /* Export known scheduler node to context thread */
    MK_TLS_SET(mk_tls_sched_worker_node, sched);
    mk_plugin_core_thread(server);

    if (server->scheduler_mode == MK_SCHEDULER_REUSEPORT) {
        sched->listeners = mk_server_listen_init(server);
        if (!sched->listeners) {
            exit(EXIT_FAILURE);
        }
    }

    /* Unlock the conditional initializator */
    pthread_mutex_lock(&server->pth_mutex);
    server->pth_init = MK_TRUE;
    pthread_cond_signal(&server->pth_cond);
    pthread_mutex_unlock(&server->pth_mutex);

    /* Invoke custom worker-callbacks defined by the scheduler (lib) */
    mk_list_foreach(head, &server->sched_worker_callbacks) {
        wcb = mk_list_entry(head, struct mk_sched_worker_cb, _head);
        wcb->cb_func(wcb->data);
    }

    mk_mem_free(thinfo);

    /* init server thread loop */
    mk_server_worker_loop(server);

    return 0;
}